

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

iterator __thiscall
iffl::
flat_forward_list_ref<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
::end(flat_forward_list_ref<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>_>
      *this)

{
  uint *puVar1;
  pointer_type pcVar2;
  ulong uVar3;
  buffer_t<char> *in_RSI;
  
  buffer_t<char>::validate(in_RSI);
  puVar1 = (uint *)in_RSI->last;
  if (puVar1 == (uint *)0x0) {
    pcVar2 = (pointer_type)0x0;
  }
  else {
    uVar3 = (ulong)*puVar1;
    if (uVar3 == 0) {
      uVar3 = (ulong)((uint)*(byte *)((long)puVar1 + 5) + (uint)*(ushort *)((long)puVar1 + 6) + 0xb
                     & 0x1fffc);
    }
    pcVar2 = (pointer_type)((long)puVar1 + uVar3);
  }
  (this->buffer_).begin = pcVar2;
  return (iterator)(buffer_char_pointer)this;
}

Assistant:

iterator end() noexcept {
        validate_pointer_invariants();
        if (buff().last) {
            if (traits_traits::has_next_offset_v) {
                size_type next_offset = traits_traits::get_next_offset(buff().last);
                if (next_offset) {
                    return iterator{ buff().last + next_offset };
                } else {
                    size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
                    return iterator{ buff().last + last_element_size.size_padded() };
                }
            } else {
                size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
                return iterator{ buff().last + last_element_size.size_padded() };
            }
        } else {
            return iterator{ };
        }
    }